

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O0

void __thiscall ExprEval::Engine::NodeList::print(NodeList *this)

{
  Node *pNVar1;
  const_reference pvVar2;
  ostream *poVar3;
  allocator local_41;
  string local_40 [8];
  string type;
  Node *node;
  size_t i;
  NodeList *this_local;
  
  for (node = (Node *)0x0;
      pNVar1 = (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                       ::size(&this->m_nodes), node < pNVar1; node = (Node *)((long)&node->type + 1)
      ) {
    pvVar2 = std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::
             operator[](&this->m_nodes,(size_type)node);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"expr",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (pvVar2->type == Number) {
      std::__cxx11::string::operator=(local_40,"num");
    }
    else if (pvVar2->type == Operator) {
      std::__cxx11::string::operator=(local_40,"opr");
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = std::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3,"]");
    std::operator<<(poVar3,"{");
    if (pvVar2->type == Number) {
      std::ostream::operator<<((ostream *)&std::cout,pvVar2->number);
    }
    else if (pvVar2->type == Operator) {
      std::operator<<((ostream *)&std::cout,(string *)&pvVar2->symbol);
    }
    else {
      std::operator<<((ostream *)&std::cout,(string *)&pvVar2->expression);
    }
    std::operator<<((ostream *)&std::cout,"} --> ");
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void NodeList::print() const{
            for(size_t i=0; i<m_nodes.size(); ++i){
                const Node* node = &(m_nodes[i]);
                std::string type = "expr";
                if(node->type == NodeType::Number){
                    type = "num";
                } else if(node->type == NodeType::Operator){
                    type = "opr";
                }
                std::cout<<"["<<type<<"]"<<"{";
                if(node->type == NodeType::Number){
                    std::cout<<node->number;
                } else if(node->type == NodeType::Operator){
                    std::cout<<node->symbol;
                } else{
                    std::cout<<node->expression;
                }
                std::cout<<"} --> ";
            }
        }